

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte *pbVar7;
  sqlite3_int64 iDelta;
  long local_30;
  
  pbVar7 = (byte *)(pDL->aAll + pDL->nAll);
  pbVar4 = (byte *)pDL->pNextDocid;
  if ((byte *)pDL->pNextDocid == (byte *)0x0) {
    pbVar4 = (byte *)pDL->aAll;
  }
  if (pbVar4 < pbVar7) {
    iVar2 = sqlite3Fts3GetVarint((char *)pbVar4,&local_30);
    pbVar4 = pbVar4 + iVar2;
    if ((pTab->bDescIdx == '\0') || (pDL->pNextDocid == (char *)0x0)) {
      pDL->iDocid = pDL->iDocid + local_30;
    }
    else {
      pDL->iDocid = pDL->iDocid - local_30;
    }
    pDL->pList = (char *)pbVar4;
    bVar5 = *pbVar4;
    pbVar3 = pbVar4;
    if (bVar5 != 0) {
      do {
        pbVar1 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
        bVar6 = bVar5 & 0x80;
        bVar5 = *pbVar1;
      } while (bVar6 != 0 || *pbVar1 != 0);
    }
    pbVar3 = pbVar3 + 1;
    pDL->nList = (int)pbVar3 - (int)pbVar4;
    for (; (pbVar3 < pbVar7 && (*pbVar3 == 0)); pbVar3 = pbVar3 + 1) {
    }
    pDL->pNextDocid = (char *)pbVar3;
    *pbEof = '\0';
  }
  else {
    *pbEof = '\x01';
  }
  return;
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd = &pDL->aAll[pDL->nAll];     /* 1 byte past end of aAll */
 
  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
  }else{
    pIter = pDL->aAll;
  }

  if( pIter>=pEnd ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}